

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O1

char * __thiscall llbuild::core::BuildEngineTrace::getRuleName(BuildEngineTrace *this,Rule *rule)

{
  long *plVar1;
  FILE *__stream;
  ulong uVar2;
  pointer pcVar3;
  char *pcVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  pair<std::__detail::_Node_iterator<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar12;
  string encoded;
  char name [64];
  Rule *local_90;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  char local_68 [72];
  
  __stream = (FILE *)this->outputPtr;
  uVar2 = (this->ruleNames)._M_h._M_bucket_count;
  uVar6 = (ulong)rule % uVar2;
  p_Var10 = (this->ruleNames)._M_h._M_buckets[uVar6];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var10->_M_nxt, p_Var11 = p_Var10, (Rule *)p_Var10->_M_nxt[1]._M_nxt != rule)) {
    while (p_Var10 = p_Var5, p_Var5 = p_Var10->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var11 = p_Var10, (Rule *)p_Var5[1]._M_nxt == rule)) goto LAB_001d75e9;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_001d75e9:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var11->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    return (char *)p_Var5[2]._M_nxt;
  }
  this->numNamedRules = this->numNamedRules + 1;
  local_90 = rule;
  snprintf(local_68,0x40,"R%d");
  pVar12 = std::
           _Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
           ::_M_emplace<llbuild::core::Rule_const*&,char(&)[64]>
                     ((_Hashtable<llbuild::core::Rule_const*,std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>,std::allocator<std::pair<llbuild::core::Rule_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<llbuild::core::Rule_const*>,std::hash<llbuild::core::Rule_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)&this->ruleNames,&local_90,local_68);
  pcVar3 = (local_90->key).key._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + (local_90->key).key._M_string_length);
  plVar1 = (long *)((long)local_88 + local_80);
  plVar8 = local_88;
  if (0 < (long)local_80 >> 2) {
    plVar8 = (long *)((long)local_88 + (local_80 & 0xfffffffffffffffc));
    lVar9 = ((long)local_80 >> 2) + 1;
    plVar7 = (long *)((long)local_88 + 3);
    do {
      if (*(char *)((long)plVar7 + -3) < ' ') {
        plVar7 = (long *)((long)plVar7 + -3);
        goto LAB_001d76fb;
      }
      if (*(char *)((long)plVar7 + -2) < ' ') {
        plVar7 = (long *)((long)plVar7 + -2);
        goto LAB_001d76fb;
      }
      if (*(char *)((long)plVar7 + -1) < ' ') {
        plVar7 = (long *)((long)plVar7 + -1);
        goto LAB_001d76fb;
      }
      if ((char)*plVar7 < ' ') goto LAB_001d76fb;
      lVar9 = lVar9 + -1;
      plVar7 = (long *)((long)plVar7 + 4);
    } while (1 < lVar9);
  }
  lVar9 = (long)plVar1 - (long)plVar8;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      plVar7 = plVar1;
      if ((lVar9 != 3) || (plVar7 = plVar8, (char)*plVar8 < ' ')) goto LAB_001d76fb;
      plVar8 = (long *)((long)plVar8 + 1);
    }
    plVar7 = plVar8;
    if ((char)*plVar8 < ' ') goto LAB_001d76fb;
    plVar8 = (long *)((long)plVar8 + 1);
  }
  plVar7 = plVar8;
  if ('\x1f' < (char)*plVar8) {
    plVar7 = plVar1;
  }
LAB_001d76fb:
  plVar8 = (long *)((long)plVar7 + 1);
  if (plVar8 != plVar1 && plVar7 != plVar1) {
    do {
      if ('\x1f' < (char)*plVar8) {
        *(char *)plVar7 = (char)*plVar8;
        plVar7 = (long *)((long)plVar7 + 1);
      }
      plVar8 = (long *)((long)plVar8 + 1);
    } while (plVar8 != plVar1);
  }
  local_80 = (long)plVar7 - (long)local_88;
  *(char *)plVar7 = '\0';
  fprintf(__stream,"{ \"new-rule\", \"%s\", \"%s\" },\n",local_68,local_88);
  pcVar4 = *(char **)((long)pVar12.first.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_llbuild::core::Rule_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     + 0x10);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return pcVar4;
}

Assistant:

const char* BuildEngineTrace::getRuleName(const Rule* rule) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  // See if we have already assigned a name.
  auto it = ruleNames.find(rule);
  if (it != ruleNames.end())
    return it->second.c_str();

  // Otherwise, create a name.
  char name[64];
  snprintf(name, sizeof(name), "R%d", ++numNamedRules);
  auto result = ruleNames.emplace(rule, name);

  // Report the newly seen rule.
  // FIXME: This is currently encoding the key by merely stripping the
  // non-printable characters. Should probably encode this into a real encoding.
  std::string encoded = rule->key.str();
  encoded.erase(
                std::remove_if(encoded.begin(), encoded.end(),
                               [](char c) -> bool {
                                 return c < 32 || c > 127; }),
                encoded.end());
  fprintf(fp, "{ \"new-rule\", \"%s\", \"%s\" },\n", name, encoded.c_str());

  return result.first->second.c_str();
}